

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.c
# Opt level: O0

apx_error_t
apx_vm_deserializer_check_value_range_uint64
          (apx_vm_deserializer_t *self,uint64_t lower_limit,uint64_t upper_limit)

{
  uint uVar1;
  uint local_30;
  uint32_t length;
  uint32_t i;
  apx_error_t retval;
  uint64_t upper_limit_local;
  uint64_t lower_limit_local;
  apx_vm_deserializer_t *self_local;
  
  if (self == (apx_vm_deserializer_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    length = 0;
    if (self->state->value_type == DTL_DV_SCALAR) {
      length = state_store_scalar_value(self->state,(self->state->value).sv,'\b');
      if (length == 0) {
        if (self->state->scalar_storage_type != '\x03') {
          __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT64",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/deserializer.c"
                        ,0x264,
                        "apx_error_t apx_vm_deserializer_check_value_range_uint64(apx_vm_deserializer_t *, uint64_t, uint64_t)"
                       );
        }
        length = apx_vm_value_in_range_u64((self->state->scalar_value).u64,lower_limit,upper_limit);
        if (length == 0) {
          self->state->range_check_state = '\x01';
        }
        else {
          self->state->range_check_state = '\x02';
        }
      }
      else {
        self->state->range_check_state = '\x02';
      }
    }
    else if (self->state->value_type == DTL_DV_ARRAY) {
      uVar1 = dtl_av_length((self->state->value).av);
      self->state->range_check_state = '\x01';
      for (local_30 = 0; local_30 < uVar1; local_30 = local_30 + 1) {
        length = state_store_scalar_array_value(self->state,local_30,'\a');
        if (length != 0) {
          self->state->range_check_state = '\x02';
          break;
        }
        if (self->state->scalar_storage_type != '\x01') {
          __assert_fail("self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/deserializer.c"
                        ,0x27e,
                        "apx_error_t apx_vm_deserializer_check_value_range_uint64(apx_vm_deserializer_t *, uint64_t, uint64_t)"
                       );
        }
        length = apx_vm_value_in_range_u64((self->state->scalar_value).u64,lower_limit,upper_limit);
        if (length != 0) {
          self->state->range_check_state = '\x02';
          break;
        }
      }
    }
    else {
      length = 10;
    }
    self_local._4_4_ = length;
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_vm_deserializer_check_value_range_uint64(apx_vm_deserializer_t* self, uint64_t lower_limit, uint64_t upper_limit)
{
   if (self != NULL)
   {
      apx_error_t retval = APX_NO_ERROR;
      if (self->state->value_type == DTL_DV_SCALAR)
      {
         retval = state_store_scalar_value(self->state, self->state->value.sv, APX_TYPE_CODE_INT64);
         if (retval == APX_NO_ERROR)
         {
            assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT64);
            retval = apx_vm_value_in_range_u64(self->state->scalar_value.u64, lower_limit, upper_limit);
            if (retval == APX_NO_ERROR)
            {
               self->state->range_check_state = APX_RANGE_CHECK_STATE_OK;
            }
            else
            {
               self->state->range_check_state = APX_RANGE_CHECK_STATE_FAIL;
            }
         }
         else
         {
            self->state->range_check_state = APX_RANGE_CHECK_STATE_FAIL;
         }
      }
      else if (self->state->value_type == DTL_DV_ARRAY)
      {
         uint32_t i;
         uint32_t length = (uint32_t)dtl_av_length(self->state->value.av);
         self->state->range_check_state = APX_RANGE_CHECK_STATE_OK;
         for (i = 0u; i < length; i++)
         {
            retval = state_store_scalar_array_value(self->state, i, APX_TYPE_CODE_INT32);
            if (retval == APX_NO_ERROR)
            {
               assert(self->state->scalar_storage_type == APX_VM_SCALAR_STORAGE_TYPE_INT32);
               retval = apx_vm_value_in_range_u64(self->state->scalar_value.u64, lower_limit, upper_limit);
               if (retval != APX_NO_ERROR)
               {
                  self->state->range_check_state = APX_RANGE_CHECK_STATE_FAIL;
                  break;
               }
            }
            else
            {
               self->state->range_check_state = APX_RANGE_CHECK_STATE_FAIL;
               break;
            }
         }
      }
      else
      {
         retval = APX_UNSUPPORTED_ERROR;
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}